

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O3

void __thiscall cmComputeComponentGraph::~cmComputeComponentGraph(cmComputeComponentGraph *this)

{
  pointer pTVar1;
  pointer piVar2;
  
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->TarjanStack);
  std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::~vector(&this->Components);
  pTVar1 = (this->TarjanEntries).
           super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)(this->TarjanEntries).
                                 super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar1);
  }
  piVar2 = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->TarjanComponents).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->TarjanVisited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->TarjanVisited).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->ComponentGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
            );
  return;
}

Assistant:

cmComputeComponentGraph::~cmComputeComponentGraph()
{
}